

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scroll_widgets.cpp
# Opt level: O2

void h_scroll_indicator_draw_proc(Am_Object *self,Am_Drawonable *draw,int x_offset,int y_offset)

{
  uint *puVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int width;
  int height;
  Am_Value *pAVar5;
  int x;
  uint uVar6;
  uint left;
  am_rect arrow_rect;
  Computed_Colors_Record color_rec;
  Am_Widget_Look look;
  
  pAVar5 = Am_Object::Get(self,100,0);
  iVar3 = Am_Value::operator_cast_to_int(pAVar5);
  pAVar5 = Am_Object::Get(self,0x65,0);
  iVar4 = Am_Value::operator_cast_to_int(pAVar5);
  pAVar5 = Am_Object::Get(self,0x66,0);
  width = Am_Value::operator_cast_to_int(pAVar5);
  pAVar5 = Am_Object::Get(self,0x67,0);
  height = Am_Value::operator_cast_to_int(pAVar5);
  pAVar5 = Am_Object::Get(self,0xcc,0);
  bVar2 = Am_Value::operator_cast_to_bool(pAVar5);
  pAVar5 = Am_Object::Get(self,0x1ad,0);
  color_rec.data = (Computed_Colors_Record_Data *)(pAVar5->value).wrapper_value;
  if (color_rec.data != (Computed_Colors_Record_Data *)0x0) {
    puVar1 = &((color_rec.data)->super_Am_Wrapper).refs;
    *puVar1 = *puVar1 + 1;
  }
  pAVar5 = Am_Object::Get(self,0x17f,0);
  Am_Widget_Look::Am_Widget_Look(&look,pAVar5);
  left = iVar3 + x_offset;
  iVar4 = iVar4 + y_offset;
  if (look.value == Am_MOTIF_LOOK_val) {
    Am_Draw_Motif_Box(left,iVar4,width,height,false,&color_rec,draw);
  }
  else if (look.value == Am_WINDOWS_LOOK_val) {
    arrow_rect.top = iVar4;
    arrow_rect.left = left;
    arrow_rect.height = height;
    arrow_rect.width = width;
    draw_win_arrow_box(arrow_rect,false,false,&color_rec,draw);
  }
  else {
    if (look.value != Am_MACINTOSH_LOOK_val) {
      Am_Error("Unknown Look parameter");
    }
    if (bVar2) {
      uVar6 = iVar4 + 1;
      (*draw->_vptr_Am_Drawonable[0x2c])
                (draw,&(color_rec.data)->highlight_style,&(color_rec.data)->background_style,
                 (ulong)(left + 1),(ulong)uVar6,0xf,0xe,0);
      (*draw->_vptr_Am_Drawonable[0x2b])
                (draw,&(color_rec.data)->shadow_style,&Am_No_Style,(ulong)left,(ulong)uVar6,
                 (ulong)left,(ulong)(iVar4 + 0xe),(ulong)(left + 0xf),(ulong)(iVar4 + 0xe),
                 (ulong)(left + 0xf),(ulong)uVar6,0);
      (*draw->_vptr_Am_Drawonable[0x2c])
                (draw,&Am_No_Style,&(color_rec.data)->highlight_style,(ulong)(left + 4),
                 (ulong)(iVar4 + 5U),9,6,0);
      for (uVar6 = 5; uVar6 < 0xc; uVar6 = uVar6 + 2) {
        (*draw->_vptr_Am_Drawonable[0x28])
                  (draw,&(color_rec.data)->background_style,(ulong)(left + uVar6),
                   (ulong)(iVar4 + 5U),(ulong)(left + uVar6),(ulong)(iVar4 + 10),0);
      }
    }
  }
  Computed_Colors_Record::~Computed_Colors_Record(&color_rec);
  return;
}

Assistant:

Am_Define_Method(Am_Draw_Method, void, h_scroll_indicator_draw,
                 (Am_Object self, Am_Drawonable *draw, int x_offset,
                  int y_offset))
{
  int left = (int)self.Get(Am_LEFT) + x_offset;
  int top = (int)self.Get(Am_TOP) + y_offset;
  int width = self.Get(Am_WIDTH);
  int height = self.Get(Am_HEIGHT);
  bool active = self.Get(Am_ACTIVE);
  Computed_Colors_Record color_rec = self.Get(Am_STYLE_RECORD);
  Am_Widget_Look look = self.Get(Am_WIDGET_LOOK);

  switch (look.value) {
  case Am_MOTIF_LOOK_val:
    Am_Draw_Motif_Box(left, top, width, height, false, color_rec, draw);
    break;

  case Am_WINDOWS_LOOK_val: {
    am_rect r(left, top, width, height);
    draw_win_arrow_box(r, false, false, color_rec, draw);
  } break;

  case Am_MACINTOSH_LOOK_val:
    if (active) {
      draw->Draw_Rectangle(color_rec.data->highlight_style,
                           color_rec.data->background_style, left + 1, top + 1,
                           15, 14);
      draw->Draw_3_Lines(color_rec.data->shadow_style, Am_No_Style, left,
                         top + 1, left, top + 14, left + 15, top + 14,
                         left + 15, top + 1);
      draw->Draw_Rectangle(Am_No_Style, color_rec.data->highlight_style,
                           left + 4, top + 5, 9, 6);
      for (int x = 5; x <= 11; x += 2)
        draw->Draw_Line(color_rec.data->background_style, left + x, top + 5,
                        left + x, top + 10);
    }
    break;

  default:
    Am_Error("Unknown Look parameter");
    break;
  }
}